

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLMatrix33.cpp
# Opt level: O2

ostream * AML::operator<<(ostream *os,Matrix33 *obj)

{
  ostream *poVar1;
  
  std::operator<<(os,"[[");
  poVar1 = std::ostream::_M_insert<double>((obj->field_0).data[0][0]);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>((obj->field_0).data[0][1]);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>((obj->field_0).data[0][2]);
  std::operator<<(poVar1,"],[");
  poVar1 = std::ostream::_M_insert<double>((obj->field_0).data[1][0]);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>((obj->field_0).data[1][1]);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>((obj->field_0).data[1][2]);
  std::operator<<(poVar1,"],[");
  poVar1 = std::ostream::_M_insert<double>((obj->field_0).data[2][0]);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>((obj->field_0).data[2][1]);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>((obj->field_0).data[2][2]);
  std::operator<<(poVar1,"]]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Matrix33& obj)
    {
        os << "[[" << obj.m11 << ", " << obj.m12 << ", " << obj.m13 << "],[" << obj.m21 << ", " << obj.m22 << ", "
           << obj.m23 << "],[" << obj.m31 << ", " << obj.m32 << ", " << obj.m33 << "]]";
        return os;
    }